

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nstime.c
# Opt level: O2

uint64_t duckdb_je_nstime_ns_since(nstime_t *past)

{
  nstime_t now;
  nstime_t local_18;
  
  local_18 = (nstime_t)past->ns;
  nstime_update_impl(&local_18);
  return local_18.ns - past->ns;
}

Assistant:

uint64_t
nstime_ns_since(const nstime_t *past) {
	nstime_assert_initialized(past);

	nstime_t now;
	nstime_copy(&now, past);
	nstime_update(&now);

	assert(nstime_compare(&now, past) >= 0);
	return now.ns - past->ns;
}